

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ParameterSymbol::serializeTo(ParameterSymbol *this,ASTSerializer *serializer)

{
  bool bVar1;
  ConstantValue *__n;
  ASTSerializer *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  ParameterSymbol *in_stack_00000128;
  undefined1 in_stack_00000130 [16];
  SourceRange *in_stack_ffffffffffffff80;
  ASTSerializer *pAVar2;
  char *in_stack_ffffffffffffff88;
  int local_60;
  void *local_58;
  int local_50;
  void *local_48;
  int local_40;
  void *local_38;
  int local_20;
  void *local_18;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RDI,in_stack_ffffffffffffff88);
  SourceRange::SourceRange(in_stack_ffffffffffffff80);
  __n = getValue(in_stack_00000128,(SourceRange)in_stack_00000130);
  ASTSerializer::write(in_RSI,local_20,local_18,(size_t)__n);
  pAVar2 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RDI,in_stack_ffffffffffffff88);
  bVar1 = ParameterSymbolBase::isLocalParam((ParameterSymbolBase *)(in_RDI + 0x15));
  ASTSerializer::write(pAVar2,local_40,local_38,(ulong)bVar1);
  pAVar2 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)in_RSI);
  bVar1 = ParameterSymbolBase::isPortParam((ParameterSymbolBase *)(in_RDI + 0x15));
  ASTSerializer::write(pAVar2,local_50,local_48,(ulong)bVar1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)pAVar2);
  bVar1 = ParameterSymbolBase::isBodyParam((ParameterSymbolBase *)0x1036d97);
  ASTSerializer::write(in_RSI,local_60,local_58,(ulong)bVar1);
  return;
}

Assistant:

void ParameterSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("value", getValue());
    serializer.write("isLocal", isLocalParam());
    serializer.write("isPort", isPortParam());
    serializer.write("isBody", isBodyParam());
}